

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_groestl.c
# Opt level: O2

void Transform(groestlHashState *ctx,uint8_t *input,int msglen)

{
  uint32_t *puVar1;
  uint uVar2;
  long lVar3;
  uint32_t Ptmp [16];
  uint32_t local_f8 [16];
  uint32_t Qtmp [16];
  uint32_t y [16];
  
  for (; 0x3f < msglen; msglen = msglen + -0x40) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      uVar2 = *(uint *)(input + lVar3 * 4);
      local_f8[lVar3] = uVar2;
      Ptmp[lVar3] = uVar2 ^ ctx->chaining[lVar3];
    }
    RND512Q((uint8_t *)local_f8,y,0);
    RND512Q((uint8_t *)y,local_f8,0x1000000);
    RND512Q((uint8_t *)local_f8,y,0x2000000);
    RND512Q((uint8_t *)y,local_f8,0x3000000);
    RND512Q((uint8_t *)local_f8,y,0x4000000);
    RND512Q((uint8_t *)y,local_f8,0x5000000);
    RND512Q((uint8_t *)local_f8,y,0x6000000);
    RND512Q((uint8_t *)y,local_f8,0x7000000);
    RND512Q((uint8_t *)local_f8,y,0x8000000);
    RND512Q((uint8_t *)y,Qtmp,0x9000000);
    RND512P((uint8_t *)Ptmp,y,0);
    RND512P((uint8_t *)y,local_f8,1);
    RND512P((uint8_t *)local_f8,y,2);
    RND512P((uint8_t *)y,local_f8,3);
    RND512P((uint8_t *)local_f8,y,4);
    RND512P((uint8_t *)y,local_f8,5);
    RND512P((uint8_t *)local_f8,y,6);
    RND512P((uint8_t *)y,local_f8,7);
    RND512P((uint8_t *)local_f8,y,8);
    RND512P((uint8_t *)y,Ptmp,9);
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      ctx->chaining[lVar3] = ctx->chaining[lVar3] ^ Qtmp[lVar3] ^ Ptmp[lVar3];
    }
    puVar1 = &ctx->block_counter1;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 == 0) {
      ctx->block_counter2 = ctx->block_counter2 + 1;
    }
    input = input + 0x40;
  }
  return;
}

Assistant:

static void Transform(groestlHashState *ctx,
	       const uint8_t *input, 
	       int msglen) {

  /* digest message, one block at a time */
  for (; msglen >= SIZE512; 
       msglen -= SIZE512, input += SIZE512) {
    F512(ctx->chaining,(uint32_t*)input);

    /* increment block counter */
    ctx->block_counter1++;
    if (ctx->block_counter1 == 0) ctx->block_counter2++;
  }
}